

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

basic_substring<char> __thiscall
c4::basic_substring<char>::trimr(basic_substring<char> *this,char c)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  char *s_;
  size_t sVar4;
  ulong uVar5;
  char *pcVar6;
  basic_substring<char> bVar7;
  basic_substring<char> local_20;
  
  s_ = this->str;
  uVar1 = this->len;
  if (s_ == (char *)0x0 || uVar1 == 0) {
    sVar4 = 0;
  }
  else {
    uVar5 = ~uVar1;
    pcVar6 = s_ + uVar1;
    do {
      pcVar6 = pcVar6 + -1;
      sVar4 = 0;
      if (uVar5 == 0xffffffffffffffff) goto LAB_001f5370;
      uVar5 = uVar5 + 1;
    } while (*pcVar6 == c);
    sVar4 = -uVar5;
    if (uVar5 == 1) {
      sVar4 = uVar1;
    }
    if (uVar1 < sVar4) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar3 = is_debugger_attached();
        if (bVar3) {
          pcVar2 = (code *)swi(3);
          bVar7 = (basic_substring<char>)(*pcVar2)();
          return bVar7;
        }
      }
      handle_error(0x214335,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
    }
    basic_substring(&local_20,s_,sVar4);
    s_ = local_20.str;
    sVar4 = local_20.len;
  }
LAB_001f5370:
  bVar7.len = sVar4;
  bVar7.str = s_;
  return bVar7;
}

Assistant:

basic_substring trimr(const C c) const
    {
        if( ! empty())
        {
            size_t pos = last_not_of(c, npos);
            if(pos != npos)
                return sub(0, pos+1);
        }
        return sub(0, 0);
    }